

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O3

string_t * __thiscall
cfgfile::format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_
          (string_t *__return_storage_ptr__,format_t<int,cfgfile::string_trait_t> *this,int *value)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  string *__str;
  uint __len;
  
  uVar1 = *(uint *)this;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00120a18;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00120a18;
      }
      if (uVar3 < 10000) goto LAB_00120a18;
      uVar4 = uVar4 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00120a18:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar1 >> 0x1f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

static string_trait_t::string_t to_string( const int & value )
	{
		return std::to_string( value );
	}